

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

pair<double,_double> __thiscall HPresolve::getImpliedRowBounds(HPresolve *this,int row)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  pair<double,_double> pVar25;
  
  uVar14 = (ulong)row;
  piVar2 = (this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar8 = (long)(this->super_HPreData).ARstart.super__Vector_base<int,_std::allocator<int>_>._M_impl
                .super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
  uVar9 = uVar8;
  uVar15 = uVar14;
  if ((uVar14 < uVar8) && (uVar7 = (ulong)(row + 1), uVar15 = uVar7, uVar7 < uVar8)) {
    iVar1 = piVar2[uVar14];
    uVar10 = (ulong)iVar1;
    iVar12 = piVar2[uVar7];
    piVar2 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
    pdVar4 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar17 = (long)(this->super_HPreData).ARvalue.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
    pdVar5 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar18 = (long)(this->super_HPreData).colLower.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
    pdVar6 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar19 = (long)(this->super_HPreData).colUpper.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
    iVar13 = iVar12;
    if (iVar12 < iVar1) {
      iVar13 = iVar1;
    }
    dVar21 = 0.0;
    uVar11 = uVar10;
    do {
      if ((long)iVar13 == uVar11) {
LAB_0014364a:
        dVar22 = 0.0;
        if (iVar12 <= iVar1) goto LAB_00143746;
        piVar2 = (this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(this->super_HPreData).ARindex.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
        piVar3 = (this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = (long)(this->super_HPreData).flagCol.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar3 >> 2;
        pdVar4 = (this->super_HPreData).ARvalue.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(this->super_HPreData).ARvalue.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pdVar4 >> 3;
        pdVar5 = (this->super_HPreData).colUpper.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar17 = (long)(this->super_HPreData).colUpper.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar5 >> 3;
        pdVar6 = (this->super_HPreData).colLower.super__Vector_base<double,_std::allocator<double>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar18 = (long)(this->super_HPreData).colLower.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pdVar6 >> 3;
        iVar12 = iVar12 - iVar1;
        uVar8 = uVar10;
        goto LAB_001436d2;
      }
      if (uVar14 <= uVar11) {
        uVar9 = uVar14;
        uVar15 = uVar10;
        if (uVar10 < uVar14) {
          uVar15 = uVar14;
        }
        break;
      }
      uVar20 = (ulong)piVar2[uVar11];
      uVar9 = uVar16;
      uVar15 = uVar20;
      if (uVar16 <= uVar20) break;
      if (piVar3[uVar20] != 0) {
        uVar9 = uVar17;
        uVar15 = uVar11;
        if (uVar11 < uVar17) {
          dVar22 = pdVar4[uVar11];
          if (0.0 <= dVar22) {
            uVar9 = uVar18;
            uVar15 = uVar20;
            if (uVar18 <= uVar20) break;
            dVar23 = pdVar5[uVar20];
            if (-1e+200 < dVar23) goto LAB_00143623;
          }
          else {
            uVar9 = uVar19;
            uVar15 = uVar20;
            if (uVar19 <= uVar20) break;
            dVar23 = pdVar6[uVar20];
            if (dVar23 < 1e+200) {
LAB_00143623:
              dVar21 = dVar21 + dVar22 * dVar23;
              goto LAB_0014362b;
            }
          }
          dVar21 = -1e+200;
          goto LAB_0014364a;
        }
        break;
      }
LAB_0014362b:
      uVar11 = uVar11 + 1;
      uVar9 = uVar8;
      uVar15 = uVar7;
    } while (uVar7 < uVar8);
  }
LAB_001437f2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar15,
             uVar9);
LAB_001436d2:
  if (uVar16 <= uVar8) {
    uVar9 = uVar16;
    uVar15 = uVar10;
    if (uVar10 < uVar16) {
      uVar15 = uVar16;
    }
    goto LAB_001437f2;
  }
  uVar19 = (ulong)piVar2[uVar8];
  uVar9 = uVar14;
  uVar15 = uVar19;
  if (uVar14 <= uVar19) goto LAB_001437f2;
  if (piVar3[uVar19] != 0) {
    uVar9 = uVar7;
    uVar15 = uVar8;
    if (uVar7 <= uVar8) goto LAB_001437f2;
    dVar23 = pdVar4[uVar8];
    if (0.0 <= dVar23) {
      uVar9 = uVar17;
      uVar15 = uVar19;
      if (uVar17 <= uVar19) goto LAB_001437f2;
      dVar24 = pdVar5[uVar19];
      if (dVar24 < 1e+200) goto LAB_00143731;
    }
    else {
      uVar9 = uVar18;
      uVar15 = uVar19;
      if (uVar18 <= uVar19) goto LAB_001437f2;
      dVar24 = pdVar6[uVar19];
      if (-1e+200 < dVar24) {
LAB_00143731:
        dVar22 = dVar22 + dVar23 * dVar24;
        goto LAB_00143739;
      }
    }
    dVar22 = 1e+200;
    goto LAB_00143746;
  }
LAB_00143739:
  uVar8 = uVar8 + 1;
  iVar12 = iVar12 + -1;
  if (iVar12 == 0) {
LAB_00143746:
    pVar25.second = dVar22;
    pVar25.first = dVar21;
    return pVar25;
  }
  goto LAB_001436d2;
}

Assistant:

pair<double, double> HPresolve::getImpliedRowBounds(int row) {
	double g=0;
	double h=0;

	int col;
	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colUpper.at(col) < HSOL_CONST_INF)
					g+= ARvalue.at(k)*colUpper.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
			else {
				if (colLower.at(col) > -HSOL_CONST_INF)
					g+= ARvalue.at(k)*colLower.at(col);
				else {
					g = -HSOL_CONST_INF;
					break;
				}
			}
		}
	}

	for (int k = ARstart.at(row); k<ARstart.at(row+1); ++k) {
		col = ARindex.at(k);
		if (flagCol.at(col)) {
			if (ARvalue.at(k) < 0) {
				if (colLower.at(col) > -HSOL_CONST_INF)
					h+= ARvalue.at(k)*colLower.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}

			}
			else {
				if (colUpper.at(col) < HSOL_CONST_INF)
					h+= ARvalue.at(k)*colUpper.at(col);
				else {
					h = HSOL_CONST_INF;
					break;
				}
			}
		}
	}
	return make_pair(g, h);
}